

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerAddAlias(HelicsBroker broker,char *interfaceName,char *alias,HelicsError *err)

{
  element_type *peVar1;
  BrokerObject *pBVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  
  pBVar2 = helics::getBrokerObject(broker,err);
  if (pBVar2 == (BrokerObject *)0x0) {
    return;
  }
  peVar1 = (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    if ((interfaceName == (char *)0x0) || (*interfaceName == '\0')) {
      if (err == (HelicsError *)0x0) {
        return;
      }
      err->error_code = -4;
      pcVar5 = "Interface name cannot be empty";
    }
    else {
      if ((alias != (char *)0x0) && (*alias != '\0')) {
        sVar3 = strlen(interfaceName);
        sVar4 = strlen(alias);
        (*peVar1->_vptr_Broker[0x19])(peVar1,sVar3,interfaceName,sVar4,alias);
        return;
      }
      if (err == (HelicsError *)0x0) {
        return;
      }
      err->error_code = -4;
      pcVar5 = "Alias cannot be empty";
    }
    err->message = pcVar5;
    return;
  }
  return;
}

Assistant:

void helicsBrokerAddAlias(HelicsBroker broker, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        brk->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}